

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool __thiscall QPDF::allowModifyAll(QPDF *this)

{
  bool bVar1;
  bool bVar2;
  int P;
  int R;
  uint local_8 [2];
  
  local_8[0] = 0;
  local_8[1] = 0;
  bVar1 = isEncrypted(this,(int *)(local_8 + 1),(int *)local_8);
  bVar2 = true;
  if (bVar1) {
    bVar2 = (local_8[0] & 0x28) == 0x28;
    if (bVar2 && (int)local_8[1] >= 3) {
      if ((local_8[0] >> 8 & 1) == 0) {
        bVar2 = false;
      }
      else {
        bVar2 = (bool)((byte)(local_8[0] >> 10) & 1);
      }
    }
    else {
      bVar2 = (int)local_8[1] < 3 && bVar2;
    }
  }
  return bVar2;
}

Assistant:

bool
QPDF::allowModifyAll()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        status = (is_bit_set(P, 4) && is_bit_set(P, 6));
        if (R >= 3) {
            status = status && (is_bit_set(P, 9) && is_bit_set(P, 11));
        }
    }
    return status;
}